

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringConverter.cpp
# Opt level: O2

bool __thiscall cali::StringConverter::to_bool(StringConverter *this,bool *okptr)

{
  pointer pcVar1;
  size_type sVar2;
  bool bVar3;
  bool bVar4;
  unsigned_long uVar5;
  size_type sVar6;
  bool bVar7;
  string lower;
  
  lower._M_dataplus._M_p = (pointer)&lower.field_2;
  lower._M_string_length = 0;
  lower.field_2._M_local_buf[0] = '\0';
  pcVar1 = (this->m_str)._M_dataplus._M_p;
  sVar2 = (this->m_str)._M_string_length;
  for (sVar6 = 0; sVar2 != sVar6; sVar6 = sVar6 + 1) {
    tolower((int)pcVar1[sVar6]);
    std::__cxx11::string::push_back((char)&lower);
  }
  bVar3 = std::operator==(&lower,"true");
  bVar7 = true;
  bVar4 = true;
  if (!bVar3) {
    bVar4 = std::operator==(&lower,"t");
    bVar7 = true;
    if (!bVar4) {
      bVar4 = std::operator==(&lower,"false");
      if (!bVar4) {
        bVar3 = std::operator==(&lower,"f");
        bVar7 = false;
        bVar4 = false;
        if (!bVar3) goto LAB_001bdf9e;
      }
      bVar7 = false;
    }
    bVar4 = true;
  }
LAB_001bdf9e:
  std::__cxx11::string::~string((string *)&lower);
  if (!bVar4) {
    uVar5 = std::__cxx11::stoul(&this->m_str,(size_t *)0x0,10);
    bVar7 = uVar5 != 0;
    bVar4 = true;
  }
  if (okptr != (bool *)0x0) {
    *okptr = bVar4;
  }
  return bVar7;
}

Assistant:

bool cali::StringConverter::to_bool(bool* okptr) const
{
    bool ok  = false;
    bool res = false;

    // try string

    {
        std::string lower;

        std::transform(m_str.begin(), m_str.end(), std::back_inserter(lower), ::tolower);

        if (lower == "true" || lower == "t") {
            ok  = true;
            res = true;
        } else if (lower == "false" || lower == "f") {
            ok  = true;
            res = false;
        }
    }

    // try numeral

    if (!ok) {
        try {
            unsigned long i = std::stoul(m_str);

            res = (i != 0);
            ok  = true;
        } catch (...) {
            ok = false;
        }
    }

    if (okptr)
        *okptr = ok;

    return res;
}